

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Utilities.h
# Opt level: O0

string * __thiscall
soul::heart::Utilities::getDescriptionOfTypeList_abi_cxx11_
          (string *__return_storage_ptr__,Utilities *this,ArrayView<soul::Type> types,
          bool alwaysParenthesise)

{
  bool bVar1;
  size_t sVar2;
  Type *this_00;
  undefined7 in_register_00000081;
  undefined1 local_9d [21];
  ArrayView<soul::Type> local_88 [2];
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  byte local_21;
  undefined1 auStack_20 [7];
  bool alwaysParenthesise_local;
  ArrayView<soul::Type> types_local;
  
  types_local.s = types.s;
  local_21 = (byte)types.e & 1;
  _auStack_20 = (Type *)this;
  types_local.e = (Type *)__return_storage_ptr__;
  if (((undefined1  [16])types & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    bVar1 = ArrayView<soul::Type>::empty((ArrayView<soul::Type> *)auStack_20);
    if (bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    sVar2 = ArrayView<soul::Type>::size((ArrayView<soul::Type> *)auStack_20);
    if (sVar2 == 1) {
      this_00 = ArrayView<soul::Type>::front((ArrayView<soul::Type> *)auStack_20);
      Type::getDescription_abi_cxx11_(__return_storage_ptr__,this_00);
      return __return_storage_ptr__;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,", ",(allocator<char> *)(local_9d + 0x14));
  joinStrings<soul::ArrayView<soul::Type>,soul::heart::Utilities::getDescriptionOfTypeList[abi:cxx11](soul::ArrayView<soul::Type>,bool)::_lambda(auto:1&)_1_>
            (&local_68,(soul *)auStack_20,local_88,(string *)local_9d,
             (anon_class_1_0_00000001 *)CONCAT71(in_register_00000081,alwaysParenthesise));
  std::operator+(&local_48,"(",&local_68);
  std::operator+(__return_storage_ptr__,&local_48,")");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)local_88);
  std::allocator<char>::~allocator((allocator<char> *)(local_9d + 0x14));
  return __return_storage_ptr__;
}

Assistant:

static std::string getDescriptionOfTypeList (ArrayView<Type> types, bool alwaysParenthesise)
    {
        if (! alwaysParenthesise)
        {
            if (types.empty())
                return {};

            if (types.size() == 1)
                return types.front().getDescription();
        }

        return "(" + joinStrings (types, ", ", [] (auto& t) { return t.getDescription(); }) + ")";
    }